

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclWriteLiberty(char *pFileName,SC_Lib *p)

{
  FILE *__stream;
  FILE *pFile;
  SC_Lib *p_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open text file \"%s\" for writing.\n",pFileName);
  }
  else {
    Abc_SclWriteLibraryText((FILE *)__stream,p);
    fclose(__stream);
    printf("Dumped internal library into Liberty file \"%s\".\n",pFileName);
  }
  return;
}

Assistant:

void Abc_SclWriteLiberty( char * pFileName, SC_Lib * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open text file \"%s\" for writing.\n", pFileName );
    else
    {
        Abc_SclWriteLibraryText( pFile, p );
        fclose( pFile );
        printf( "Dumped internal library into Liberty file \"%s\".\n", pFileName );
    }
}